

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O0

int __thiscall QResourceFileEngine::open(QResourceFileEngine *this,char *__file,int __oflag,...)

{
  byte bVar1;
  bool bVar2;
  Compression CVar3;
  QResourceFileEnginePrivate *this_00;
  long in_FS_OFFSET;
  QResourceFileEnginePrivate *d;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  int errorCode;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar4;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_54;
  QMessageLogger local_50;
  undefined4 local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = SUB84(__file,0);
  local_10 = ___oflag;
  this_00 = d_func((QResourceFileEngine *)0x2e9b3a);
  QResource::fileName((QResource *)this);
  bVar1 = QString::isEmpty((QString *)0x2e9b5c);
  QString::~QString((QString *)0x2e9b6a);
  if ((bVar1 & 1) == 0) {
    local_54.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,
                    CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c)));
    errorCode = (int)((ulong)this >> 0x20);
    bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_54);
    if (bVar2) {
      uVar4 = 0;
    }
    else {
      CVar3 = QResource::compressionAlgorithm((QResource *)this_00);
      if (CVar3 != NoCompression) {
        QResourceFileEnginePrivate::uncompress(this_00);
        bVar2 = QByteArray::isNull((QByteArray *)0x2e9bff);
        if (bVar2) {
          QSystemError::stdString(errorCode);
          QString::operator=((QString *)this_00,
                             (QString *)
                             CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                                     CONCAT24(in_stack_ffffffffffffff5c,
                                                              in_stack_ffffffffffffff58))));
          QString::~QString((QString *)0x2e9c31);
          uVar4 = 0;
          goto LAB_002e9c84;
        }
      }
      bVar2 = QResource::isValid((QResource *)this_00);
      if (bVar2) {
        uVar4 = 1;
      }
      else {
        QSystemError::stdString(errorCode);
        QString::operator=((QString *)this_00,
                           (QString *)
                           CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                                   CONCAT24(in_stack_ffffffffffffff5c,
                                                            in_stack_ffffffffffffff58))));
        QString::~QString((QString *)0x2e9c78);
        uVar4 = 0;
      }
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               (char *)this,(int)((ulong)this_00 >> 0x20),
               (char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff5e,
                                               CONCAT24(in_stack_ffffffffffffff5c,
                                                        in_stack_ffffffffffffff58))));
    QMessageLogger::warning(&local_50,"QResourceFileEngine::open: Missing file name");
    uVar4 = 0;
  }
LAB_002e9c84:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar4);
}

Assistant:

bool QResourceFileEngine::open(QIODevice::OpenMode flags,
                               std::optional<QFile::Permissions> permissions)
{
    Q_UNUSED(permissions);

    Q_D(QResourceFileEngine);
    if (d->resource.fileName().isEmpty()) {
        qWarning("QResourceFileEngine::open: Missing file name");
        return false;
    }
    if (flags & QIODevice::WriteOnly)
        return false;
    if (d->resource.compressionAlgorithm() != QResource::NoCompression) {
        d->uncompress();
        if (d->uncompressed.isNull()) {
            d->errorString = QSystemError::stdString(EIO);
            return false;
        }
    }
    if (!d->resource.isValid()) {
        d->errorString = QSystemError::stdString(ENOENT);
        return false;
    }
    return true;
}